

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_set_implemented(lys_module *module)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  UNRES_ITEM *local_40;
  unres_schema *puStack_20;
  int disabled;
  unres_schema *unres;
  lys_module *module_local;
  
  unres = (unres_schema *)module;
  if (module == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_set_implemented");
    module_local._4_4_ = 1;
  }
  else {
    unres = (unres_schema *)lys_main_module(module);
    bVar3 = (*(ushort *)&((lys_module *)unres)->field_0x40 >> 6 & 1) != 0;
    if (bVar3) {
      lys_set_enabled((lys_module *)unres);
    }
    if ((*(ushort *)&unres[1].module >> 7 & 1) == 0) {
      puStack_20 = (unres_schema *)calloc(1,0x28);
      if (puStack_20 == (unres_schema *)0x0) {
        ly_log((ly_ctx *)unres->item,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_set_implemented");
        if (bVar3) {
          lys_set_disabled((lys_module *)unres);
        }
        module_local._4_4_ = 1;
      }
      else {
        *(ushort *)&unres[1].module = *(ushort *)&unres[1].module & 0xff7f | 0x80;
        iVar1 = lys_make_implemented_r((lys_module *)unres,puStack_20);
        if ((iVar1 == 0) &&
           ((puStack_20->count == 0 ||
            (iVar1 = resolve_unres_schema((lys_module *)unres,puStack_20), iVar1 == 0)))) {
          unres_schema_free((lys_module *)0x0,&stack0xffffffffffffffe0,0);
          pcVar2 = "";
          if (*(char *)((long)&unres[1].module + 4) != '\0') {
            pcVar2 = "@";
          }
          if (*(char *)((long)&unres[1].module + 4) == '\0') {
            local_40 = (UNRES_ITEM *)0x1eea57;
          }
          else {
            local_40 = unres[2].type;
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s%s%s\" now implemented.",unres->type,
                 pcVar2,local_40);
          module_local._4_4_ = 0;
        }
        else {
          if (bVar3) {
            lys_set_disabled((lys_module *)unres);
          }
          *(ushort *)&unres[1].module = *(ushort *)&unres[1].module & 0xff7f;
          unres_schema_free((lys_module *)unres,&stack0xffffffffffffffe0,1);
          module_local._4_4_ = 1;
        }
      }
    }
    else {
      module_local._4_4_ = 0;
    }
  }
  return module_local._4_4_;
}

Assistant:

API int
lys_set_implemented(const struct lys_module *module)
{
    struct unres_schema *unres;
    int disabled = 0;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    }

    module = lys_main_module(module);

    if (module->disabled) {
        disabled = 1;
        lys_set_enabled(module);
    }

    if (module->implemented) {
        return EXIT_SUCCESS;
    }

    unres = calloc(1, sizeof *unres);
    if (!unres) {
        LOGMEM(module->ctx);
        if (disabled) {
            /* set it back disabled */
            lys_set_disabled(module);
        }
        return EXIT_FAILURE;
    }
    /* recursively make the module implemented */
    ((struct lys_module *)module)->implemented = 1;
    if (lys_make_implemented_r((struct lys_module *)module, unres)) {
        goto error;
    }

    /* try again resolve augments in other modules possibly augmenting this one,
     * since we have just enabled it
     */
    /* resolve rest of unres items */
    if (unres->count && resolve_unres_schema((struct lys_module *)module, unres)) {
        goto error;
    }
    unres_schema_free(NULL, &unres, 0);

    LOGVRB("Module \"%s%s%s\" now implemented.", module->name, (module->rev_size ? "@" : ""),
           (module->rev_size ? module->rev[0].date : ""));
    return EXIT_SUCCESS;

error:
    if (disabled) {
        /* set it back disabled */
        lys_set_disabled(module);
    }

    ((struct lys_module *)module)->implemented = 0;
    unres_schema_free((struct lys_module *)module, &unres, 1);
    return EXIT_FAILURE;
}